

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_switch_deviations(lys_module *module)

{
  lys_module *module_00;
  char *pcVar1;
  size_t sVar2;
  char *ptr;
  lys_module *mod;
  uint32_t j;
  uint32_t i;
  lys_module *module_local;
  
  mod._4_4_ = 0;
  _j = module;
  if (((byte)module->field_0x40 >> 4 & 3) != 0) {
    while (module_00 = ly_ctx_get_module_iter(_j->ctx,(uint32_t *)((long)&mod + 4)),
          module_00 != (lys_module *)0x0) {
      if (module_00 != _j) {
        for (mod._0_4_ = 0; (uint)mod < module_00->deviation_size; mod._0_4_ = (uint)mod + 1) {
          pcVar1 = strstr(module_00->deviation[(uint)mod].target_name,_j->name);
          if ((pcVar1 != (char *)0x0) && (sVar2 = strlen(_j->name), pcVar1[sVar2] == ':')) {
            lys_switch_deviation(module_00->deviation + (uint)mod,module_00);
          }
        }
      }
    }
    if (((byte)_j->field_0x40 >> 4 & 3) == 2) {
      _j->field_0x40 = _j->field_0x40 & 0xcf | 0x10;
    }
    else {
      _j->field_0x40 = _j->field_0x40 & 0xcf | 0x20;
    }
  }
  return;
}

Assistant:

void
lys_switch_deviations(struct lys_module *module)
{
    uint32_t i = 0, j;
    const struct lys_module *mod;
    const char *ptr;

    if (module->deviated) {
        while ((mod = ly_ctx_get_module_iter(module->ctx, &i))) {
            if (mod == module) {
                continue;
            }

            for (j = 0; j < mod->deviation_size; ++j) {
                ptr = strstr(mod->deviation[j].target_name, module->name);
                if (ptr && ptr[strlen(module->name)] == ':') {
                    lys_switch_deviation(&mod->deviation[j], mod);
                }
            }
        }

        if (module->deviated == 2) {
            module->deviated = 1;
        } else {
            module->deviated = 2;
        }
    }
}